

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O0

void __thiscall FIX::SocketInitiator::onTimeout(SocketInitiator *this,SocketConnector *param_1)

{
  bool bVar1;
  pointer ppVar2;
  sockaddr *__addr;
  int __fd;
  _Self local_38;
  _Base_ptr local_30;
  _Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_> local_28;
  iterator i;
  time_t now;
  SocketConnector *param_1_local;
  SocketInitiator *this_local;
  
  __fd = (int)param_1;
  time((time_t *)&i);
  if ((long)this->m_reconnectInterval <= (long)i._M_node - this->m_lastConnect) {
    Initiator::connect(&this->super_Initiator,__fd,__addr,this->m_reconnectInterval);
    this->m_lastConnect = (time_t)i._M_node;
  }
  std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_>::_Rb_tree_iterator
            (&local_28);
  local_30 = (_Base_ptr)
             std::
             map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
             ::begin(&this->m_connections);
  local_28._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
         ::end(&this->m_connections);
    bVar1 = std::operator!=(&local_28,&local_38);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_>::operator->
                       (&local_28);
    SocketConnection::onTimeout(ppVar2->second);
    std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_>::operator++(&local_28);
  }
  return;
}

Assistant:

void SocketInitiator::onTimeout(SocketConnector &) {
  time_t now;
  ::time(&now);

  if ((now - m_lastConnect) >= m_reconnectInterval) {
    connect();
    m_lastConnect = now;
  }

  SocketConnections::iterator i;
  for (i = m_connections.begin(); i != m_connections.end(); ++i) {
    i->second->onTimeout();
  }
}